

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O1

int lj_cf_package_loadlib(lua_State *L)

{
  TValue *pTVar1;
  TValue TVar2;
  int iVar3;
  char *pcVar4;
  char *name;
  int iVar5;
  
  iVar5 = 1;
  pcVar4 = luaL_checklstring(L,1,(size_t *)0x0);
  name = luaL_checklstring(L,2,(size_t *)0x0);
  iVar3 = ll_loadfunc(L,pcVar4,name,1);
  if (iVar3 != 0) {
    (L->top->field_2).it = 0xffffffff;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1 + 1) {
      lj_state_growstack(L,1);
    }
    pTVar1 = L->top;
    TVar2 = pTVar1[-1];
    pTVar1[-1] = pTVar1[-2];
    *pTVar1 = TVar2;
    pTVar1[-2] = *L->top;
    pcVar4 = "init";
    if (iVar3 == 1) {
      pcVar4 = "open";
    }
    lua_pushstring(L,pcVar4);
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

static int lj_cf_package_loadlib(lua_State *L)
{
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int st = ll_loadfunc(L, path, init, 1);
  if (st == 0) {  /* no errors? */
    return 1;  /* return the loaded function */
  } else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (st == PACKAGE_ERR_LIB) ?  PACKAGE_LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}